

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_GLYPH(effect_handler_context_t_conflict *context)

{
  ushort uVar1;
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  _Bool _Var2;
  loc grid_03;
  object *poVar3;
  wchar_t num_runes;
  loc_conflict decoy;
  effect_handler_context_t_conflict *context_local;
  
  grid_03 = cave_find_decoy(cave);
  uVar1 = cave->feeling_squares;
  context->ident = true;
  _Var2 = loc_is_zero(grid_03);
  if ((_Var2) || (context->subtype != 2)) {
    if (((uint)((int)(uint)uVar1 >> 8) < 4) || (context->subtype != 1)) {
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      _Var2 = square_istrappable((chunk *)cave,grid);
      if (_Var2) {
        grid_00.x = (player->grid).x;
        grid_00.y = (player->grid).y;
        poVar3 = square_object((chunk *)cave,grid_00);
        if (poVar3 != (object *)0x0) {
          grid_01.x = (player->grid).x;
          grid_01.y = (player->grid).y;
          push_object(grid_01);
        }
        grid_02.x = (player->grid).x;
        grid_02.y = (player->grid).y;
        square_add_glyph((chunk *)cave,grid_02,context->subtype);
        context_local._7_1_ = true;
      }
      else {
        msg("There is no clear floor on which to cast the spell.");
        context_local._7_1_ = false;
      }
    }
    else {
      msg("You can only lay four glyphs at a time.");
      context_local._7_1_ = false;
    }
  }
  else {
    msg("You can only deploy one decoy at a time.");
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_GLYPH(effect_handler_context_t *context)
{
	struct loc decoy = cave_find_decoy(cave);
	int num_runes = cave->feeling_squares >> 8;

	/* Always notice */
	context->ident = true;

	/* Only one decoy at a time */
	if (!loc_is_zero(decoy) && (context->subtype == GLYPH_DECOY)) {
		msg("You can only deploy one decoy at a time.");
		return false;
	}

	/* No more than four glyphs at a time */
	if ((num_runes >= 4) && (context->subtype == GLYPH_WARDING)) {
		msg("You can only lay four glyphs at a time.");
		return false;
	}

	/* See if the effect works */
	if (!square_istrappable(cave, player->grid)) {
		msg("There is no clear floor on which to cast the spell.");
		return false;
	}

	/* Push objects off the grid */
	if (square_object(cave, player->grid))
		push_object(player->grid);

	/* Create a glyph */
	square_add_glyph(cave, player->grid, context->subtype);

	return true;
}